

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O0

int x11_authcmp(void *av,void *bv)

{
  X11FakeAuth *b;
  X11FakeAuth *a;
  void *bv_local;
  void *av_local;
  
  if (*av < *bv) {
    av_local._4_4_ = -1;
  }
  else if (*bv < *av) {
    av_local._4_4_ = 1;
  }
  else if (*av == 1) {
    if (*(int *)((long)av + 0x10) < *(int *)((long)bv + 0x10)) {
      av_local._4_4_ = -1;
    }
    else if (*(int *)((long)bv + 0x10) < *(int *)((long)av + 0x10)) {
      av_local._4_4_ = 1;
    }
    else {
      av_local._4_4_ =
           memcmp(*(void **)((long)av + 8),*(void **)((long)bv + 8),(long)*(int *)((long)av + 0x10))
      ;
    }
  }
  else {
    if (*av != 2) {
      __assert_fail("a->proto == X11_XDM",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                    ,0xa3,"int x11_authcmp(void *, void *)");
    }
    av_local._4_4_ = memcmp(*(void **)((long)av + 0x28),*(void **)((long)bv + 0x28),8);
  }
  return av_local._4_4_;
}

Assistant:

int x11_authcmp(void *av, void *bv)
{
    struct X11FakeAuth *a = (struct X11FakeAuth *)av;
    struct X11FakeAuth *b = (struct X11FakeAuth *)bv;

    if (a->proto < b->proto)
        return -1;
    else if (a->proto > b->proto)
        return +1;

    if (a->proto == X11_MIT) {
        if (a->datalen < b->datalen)
            return -1;
        else if (a->datalen > b->datalen)
            return +1;

        return memcmp(a->data, b->data, a->datalen);
    } else {
        assert(a->proto == X11_XDM);

        return memcmp(a->xa1_firstblock, b->xa1_firstblock, 8);
    }
}